

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O0

void decode_nvrm_ioctl_create_vspace(nvrm_ioctl_create_vspace *s)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *__n;
  nvrm_ioctl_create_vspace *s_local;
  
  if ((s->cid != 0) || (iVar1 = _nvrm_field_enabled("cid"), iVar1 != 0)) {
    fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)s->cid);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->handle != 0) || (iVar1 = _nvrm_field_enabled("handle"), iVar1 != 0)) {
    if ((s->handle != 0) || (iVar1 = _nvrm_field_enabled("handle"), iVar1 != 0)) {
      fprintf(_stdout,"%shandle: 0x%08x",nvrm_pfx,(ulong)s->handle);
    }
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->handle,"handle");
  }
  fprintf(_stdout,"%sclass: 0x%04x",nvrm_pfx,(ulong)s->cls);
  pcVar2 = nvrm_get_class_name(s->cls);
  if (pcVar2 != (char *)0x0) {
    fprintf(_stdout," [%s]",pcVar2);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->parent != 0) || (iVar1 = _nvrm_field_enabled("parent"), iVar1 != 0)) {
    if ((s->parent != 0) || (iVar1 = _nvrm_field_enabled("parent"), iVar1 != 0)) {
      fprintf(_stdout,"%sparent: 0x%08x",nvrm_pfx,(ulong)s->parent);
    }
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->parent,"parent");
  }
  if ((s->flags != 0) || (iVar1 = _nvrm_field_enabled("flags"), iVar1 != 0)) {
    fprintf(_stdout,"%sflags: 0x%08x",nvrm_pfx,(ulong)s->flags);
  }
  nvrm_pfx = nvrm_sep;
  if (s->_pad1 != 0) {
    fprintf(_stdout,"%s%s_pad1: 0x%08x%s",nvrm_sep,colors->err,(ulong)s->_pad1,colors->reset);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->foffset != 0) || (iVar1 = _nvrm_field_enabled("foffset"), iVar1 != 0)) {
    fprintf(_stdout,"%sfoffset: 0x%016lx",nvrm_pfx,s->foffset);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->limit != 0) || (iVar1 = _nvrm_field_enabled("limit"), iVar1 != 0)) {
    fprintf(_stdout,"%slimit: 0x%016lx",nvrm_pfx,s->limit);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->status != 0) || (iVar1 = _nvrm_field_enabled("status"), iVar1 != 0)) {
    __stream = _stdout;
    pcVar2 = nvrm_pfx;
    pcVar3 = nvrm_status(s->status);
    fprintf(__stream,"%sstatus: %s",pcVar2,pcVar3);
  }
  nvrm_pfx = nvrm_sep;
  if (s->_pad2 != 0) {
    fprintf(_stdout,"%s%s_pad2: 0x%08x%s",nvrm_sep,colors->err,(ulong)s->_pad2,colors->reset);
  }
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"\n");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_create_vspace(struct nvrm_ioctl_create_vspace *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_class(s, cls);
	nvrm_print_handle(s, parent, cid);
	nvrm_print_x32(s, flags);
	nvrm_print_pad_x32(s, _pad1);
	nvrm_print_x64(s, foffset);
	nvrm_print_x64(s, limit);
	nvrm_print_status(s, status);
	nvrm_print_pad_x32(s, _pad2);
	nvrm_print_ln();
}